

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::CalendarAstronomer::Horizon::toString(UnicodeString *__return_storage_ptr__,Horizon *this)

{
  Horizon *this_local;
  
  UnicodeString::UnicodeString(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CalendarAstronomer::Horizon::toString() const
{
#ifdef U_DEBUG_ASTRO
    char tmp[800];
    sprintf(tmp, "[%.5f,%.5f]", altitude*RAD_DEG, azimuth*RAD_DEG);
    return UnicodeString(tmp, "");
#else
    return UnicodeString();
#endif
}